

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

TValue * debug_localname(lua_State *L,lua_Debug *ar,char **name,BCReg slot1)

{
  uint64_t uVar1;
  uint uVar2;
  BCPos pc_00;
  GCfunc *pGVar3;
  GCfunc *fn_00;
  char *pcVar4;
  GCfunc *local_68;
  GCproto *pt;
  BCPos pc;
  GCfunc *fn;
  TValue *nextframe;
  TValue *frame;
  uint32_t size;
  uint32_t offset;
  BCReg slot1_local;
  char **name_local;
  lua_Debug *ar_local;
  lua_State *L_local;
  
  uVar2 = (uint)ar->i_ci >> 0x10;
  pGVar3 = (GCfunc *)((L->stack).ptr64 + (ulong)(ar->i_ci & 0xffff) * 8);
  if (uVar2 == 0) {
    local_68 = (GCfunc *)0x0;
  }
  else {
    local_68 = (GCfunc *)((long)pGVar3 + (ulong)uVar2 * 8);
  }
  fn = local_68;
  fn_00 = (GCfunc *)(*(ulong *)((long)pGVar3 + -8) & 0x7fffffffffff);
  pc_00 = debug_framepc(L,fn_00,(cTValue *)local_68);
  if (local_68 == (GCfunc *)0x0) {
    fn = (GCfunc *)(L->top + 1);
  }
  if ((int)slot1 < 0) {
    if ((pc_00 != 0xffffffff) && (uVar1 = (fn_00->c).pc.ptr64, (*(byte *)(uVar1 - 0x2b) & 2) != 0))
    {
      uVar2 = *(byte *)(uVar1 - 0x5e) - slot1;
      nextframe = (TValue *)pGVar3;
      if (((pGVar3->c).nextgc.gcptr64 & 7) == 3) {
        nextframe = (TValue *)((long)pGVar3 - ((pGVar3->c).nextgc.gcptr64 & 0xfffffffffffffff8));
        fn = pGVar3;
      }
      if ((GCfunc *)(nextframe + (ulong)uVar2 + 1) < fn) {
        *name = "(*vararg)";
        return nextframe + uVar2;
      }
    }
    return (TValue *)0x0;
  }
  if (pc_00 != 0xffffffff) {
    pcVar4 = debug_varname((GCproto *)((fn_00->c).pc.ptr64 - 0x68),pc_00,slot1 - 1);
    *name = pcVar4;
    if (pcVar4 != (char *)0x0) goto LAB_0011b967;
  }
  if ((slot1 != 0) && ((GCfunc *)((long)pGVar3 + (ulong)slot1 * 8 + 8) < fn)) {
    *name = "(*temporary)";
  }
LAB_0011b967:
  return (TValue *)((long)pGVar3 + (ulong)slot1 * 8);
}

Assistant:

static TValue *debug_localname(lua_State *L, const lua_Debug *ar,
			       const char **name, BCReg slot1)
{
  uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
  uint32_t size = (uint32_t)ar->i_ci >> 16;
  TValue *frame = tvref(L->stack) + offset;
  TValue *nextframe = size ? frame + size : NULL;
  GCfunc *fn = frame_func(frame);
  BCPos pc = debug_framepc(L, fn, nextframe);
  if (!nextframe) nextframe = L->top+LJ_FR2;
  if ((int)slot1 < 0) {  /* Negative slot number is for varargs. */
    if (pc != NO_BCPOS) {
      GCproto *pt = funcproto(fn);
      if ((pt->flags & PROTO_VARARG)) {
	slot1 = pt->numparams + (BCReg)(-(int)slot1);
	if (frame_isvarg(frame)) {  /* Vararg frame has been set up? (pc!=0) */
	  nextframe = frame;
	  frame = frame_prevd(frame);
	}
	if (frame + slot1+LJ_FR2 < nextframe) {
	  *name = "(*vararg)";
	  return frame+slot1;
	}
      }
    }
    return NULL;
  }
  if (pc != NO_BCPOS &&
      (*name = debug_varname(funcproto(fn), pc, slot1-1)) != NULL)
    ;
  else if (slot1 > 0 && frame + slot1+LJ_FR2 < nextframe)
    *name = "(*temporary)";
  return frame+slot1;
}